

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.h
# Opt level: O2

void __thiscall snestistics::Trace::Trace(Trace *this,Trace *param_1)

{
  uint32_t uVar1;
  undefined4 uVar2;
  
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>,_std::_Select1st<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>_>
  ::_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>,_std::_Select1st<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>_>
              *)this,(_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>,_std::_Select1st<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>_>
                      *)param_1);
  std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::vector
            (&this->ops_variants,&param_1->ops_variants);
  uVar1 = (param_1->labels)._num_elements;
  uVar2 = *(undefined4 *)&(param_1->labels).field_0xc;
  (this->labels)._state = (param_1->labels)._state;
  (this->labels)._num_elements = uVar1;
  *(undefined4 *)&(this->labels).field_0xc = uVar2;
  std::vector<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>::
  vector(&this->memory_accesses,&param_1->memory_accesses);
  std::vector<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>::vector
            (&this->dma_transfers,&param_1->dma_transfers);
  uVar1 = (param_1->is_predicted)._num_elements;
  uVar2 = *(undefined4 *)&(param_1->is_predicted).field_0xc;
  (this->is_predicted)._state = (param_1->is_predicted)._state;
  (this->is_predicted)._num_elements = uVar1;
  *(undefined4 *)&(this->is_predicted).field_0xc = uVar2;
  return;
}

Assistant:

Trace() : labels(256*64*1024), is_predicted(256*64*1024) {}